

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBvhTriangleMeshShape.cpp
# Opt level: O0

void __thiscall
btBvhTriangleMeshShape::performConvexcast
          (btBvhTriangleMeshShape *this,btTriangleCallback *callback,btVector3 *raySource,
          btVector3 *rayTarget,btVector3 *aabbMin,btVector3 *aabbMax)

{
  btQuantizedBvh *in_R9;
  MyNodeOverlapCallback myNodeCallback;
  btVector3 *in_stack_ffffffffffffffa8;
  MyNodeOverlapCallback *in_stack_ffffffffffffffb0;
  btVector3 *in_stack_ffffffffffffffb8;
  btVector3 *in_stack_ffffffffffffffc0;
  btNodeOverlapCallback *in_stack_ffffffffffffffc8;
  
  performConvexcast::MyNodeOverlapCallback::MyNodeOverlapCallback
            (in_stack_ffffffffffffffb0,(btTriangleCallback *)in_stack_ffffffffffffffa8,
             (btStridingMeshInterface *)&stack0xffffffffffffffb8);
  btQuantizedBvh::reportBoxCastOverlappingNodex
            (in_R9,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             (btVector3 *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  performConvexcast::MyNodeOverlapCallback::~MyNodeOverlapCallback
            ((MyNodeOverlapCallback *)0x1a9115);
  return;
}

Assistant:

void	btBvhTriangleMeshShape::performConvexcast (btTriangleCallback* callback, const btVector3& raySource, const btVector3& rayTarget, const btVector3& aabbMin, const btVector3& aabbMax)
{
	struct	MyNodeOverlapCallback : public btNodeOverlapCallback
	{
		btStridingMeshInterface*	m_meshInterface;
		btTriangleCallback* m_callback;

		MyNodeOverlapCallback(btTriangleCallback* callback,btStridingMeshInterface* meshInterface)
			:m_meshInterface(meshInterface),
			m_callback(callback)
		{
		}
				
		virtual void processNode(int nodeSubPart, int nodeTriangleIndex)
		{
			btVector3 m_triangle[3];
			const unsigned char *vertexbase;
			int numverts;
			PHY_ScalarType type;
			int stride;
			const unsigned char *indexbase;
			int indexstride;
			int numfaces;
			PHY_ScalarType indicestype;

			m_meshInterface->getLockedReadOnlyVertexIndexBase(
				&vertexbase,
				numverts,
				type,
				stride,
				&indexbase,
				indexstride,
				numfaces,
				indicestype,
				nodeSubPart);

			unsigned int* gfxbase = (unsigned int*)(indexbase+nodeTriangleIndex*indexstride);
			btAssert(indicestype==PHY_INTEGER||indicestype==PHY_SHORT);
	
			const btVector3& meshScaling = m_meshInterface->getScaling();
			for (int j=2;j>=0;j--)
			{
				int graphicsindex = indicestype==PHY_SHORT?((unsigned short*)gfxbase)[j]:gfxbase[j];

				if (type == PHY_FLOAT)
				{
					float* graphicsbase = (float*)(vertexbase+graphicsindex*stride);

					m_triangle[j] = btVector3(graphicsbase[0]*meshScaling.getX(),graphicsbase[1]*meshScaling.getY(),graphicsbase[2]*meshScaling.getZ());		
				}
				else
				{
					double* graphicsbase = (double*)(vertexbase+graphicsindex*stride);
					
					m_triangle[j] = btVector3(btScalar(graphicsbase[0])*meshScaling.getX(),btScalar(graphicsbase[1])*meshScaling.getY(),btScalar(graphicsbase[2])*meshScaling.getZ());		
				}
			}

			/* Perform ray vs. triangle collision here */
			m_callback->processTriangle(m_triangle,nodeSubPart,nodeTriangleIndex);
			m_meshInterface->unLockReadOnlyVertexBase(nodeSubPart);
		}
	};

	MyNodeOverlapCallback	myNodeCallback(callback,m_meshInterface);

	m_bvh->reportBoxCastOverlappingNodex (&myNodeCallback, raySource, rayTarget, aabbMin, aabbMax);
}